

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.hpp
# Opt level: O2

void __thiscall OpenMD::NPA::~NPA(NPA *this)

{
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPT_002c0250;
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->super_NPT).oldJi.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->super_NPT).oldVel.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->super_NPT).oldPos.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  Integrator::~Integrator((Integrator *)this);
  return;
}

Assistant:

NPA(SimInfo* info) : NPT(info) {}